

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O1

void av1_quantize_fp_facade
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,MACROBLOCK_PLANE *p,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,uint16_t *eob_ptr,SCAN_ORDER *sc,QUANT_PARAM *qparam)

{
  byte bVar1;
  short sVar2;
  qm_val_t *pqVar3;
  int16_t *piVar4;
  int16_t *piVar5;
  int iVar6;
  byte bVar7;
  uint16_t uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  _func_void_tran_low_t_ptr_intptr_t_int16_t_ptr_int16_t_ptr_int16_t_ptr_int16_t_ptr_tran_low_t_ptr_tran_low_t_ptr_int16_t_ptr_uint16_t_ptr_int16_t_ptr_int16_t_ptr
  **pp_Var16;
  bool bVar17;
  undefined4 local_74;
  int local_60 [2];
  uint16_t *local_58;
  int16_t *local_50;
  tran_low_t *local_48;
  tran_low_t *local_40;
  qm_val_t *local_38;
  
  pqVar3 = qparam->qmatrix;
  local_38 = qparam->iqmatrix;
  if (local_38 == (qm_val_t *)0x0 || pqVar3 == (qm_val_t *)0x0) {
    iVar6 = qparam->log_scale;
    if (iVar6 == 2) {
      pp_Var16 = &av1_quantize_fp_64x64;
    }
    else if (iVar6 == 1) {
      pp_Var16 = &av1_quantize_fp_32x32;
    }
    else {
      if (iVar6 != 0) {
        return;
      }
      pp_Var16 = &av1_quantize_fp;
    }
    (**pp_Var16)(coeff_ptr,n_coeffs,p->zbin_QTX,p->round_fp_QTX,p->quant_fp_QTX,p->quant_shift_QTX,
                 qcoeff_ptr,dqcoeff_ptr,p->dequant_QTX,eob_ptr,sc->scan,sc->iscan);
  }
  else {
    local_50 = p->quant_fp_QTX;
    bVar7 = (byte)qparam->log_scale;
    piVar4 = p->dequant_QTX;
    iVar6 = (1 << (bVar7 & 0x1f)) >> 1;
    local_60[0] = *p->round_fp_QTX + iVar6 >> (bVar7 & 0x1f);
    piVar5 = sc->scan;
    local_60[1] = p->round_fp_QTX[1] + iVar6 >> (bVar7 & 0x1f);
    local_58 = eob_ptr;
    local_40 = qcoeff_ptr;
    memset(qcoeff_ptr,0,n_coeffs * 4);
    local_48 = dqcoeff_ptr;
    memset(dqcoeff_ptr,0,n_coeffs * 4);
    if (n_coeffs < 1) {
      uVar8 = 0;
    }
    else {
      local_74 = 0xffffffff;
      lVar12 = 0;
      do {
        lVar13 = (long)piVar5[lVar12];
        bVar17 = lVar13 != 0;
        iVar6 = coeff_ptr[lVar13];
        uVar15 = (ulong)pqVar3[lVar13];
        sVar2 = piVar4[bVar17];
        iVar9 = -iVar6;
        if (0 < iVar6) {
          iVar9 = iVar6;
        }
        if ((long)((int)sVar2 << (4 - bVar7 & 0x1f)) <= (long)((long)iVar9 * uVar15)) {
          lVar10 = (long)local_60[bVar17] + (long)iVar9;
          if (0x7ffe < lVar10) {
            lVar10 = 0x7fff;
          }
          if (lVar10 < -0x7fff) {
            lVar10 = -0x8000;
          }
          uVar14 = iVar6 >> 0x1f;
          bVar1 = local_38[lVar13];
          uVar11 = (uint)((long)((long)local_50[bVar17] * uVar15 * lVar10) >> (0x15 - bVar7 & 0x3f))
          ;
          local_40[lVar13] = (uVar14 ^ uVar11) - uVar14;
          local_48[lVar13] =
               ((int)(((int)((uint)bVar1 * (int)sVar2 + 0x10) >> 5) * uVar11) >> (bVar7 & 0x1f) ^
               uVar14) - uVar14;
          if (uVar11 != 0) {
            local_74 = (undefined4)lVar12;
          }
        }
        lVar12 = lVar12 + 1;
      } while (n_coeffs != lVar12);
      uVar8 = (short)local_74 + 1;
    }
    *local_58 = uVar8;
  }
  return;
}

Assistant:

void av1_quantize_fp_facade(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                            const MACROBLOCK_PLANE *p, tran_low_t *qcoeff_ptr,
                            tran_low_t *dqcoeff_ptr, uint16_t *eob_ptr,
                            const SCAN_ORDER *sc, const QUANT_PARAM *qparam) {
  const qm_val_t *qm_ptr = qparam->qmatrix;
  const qm_val_t *iqm_ptr = qparam->iqmatrix;
  if (qm_ptr != NULL && iqm_ptr != NULL) {
    quantize_fp_helper_c(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_fp_QTX,
                         p->quant_fp_QTX, p->quant_shift_QTX, qcoeff_ptr,
                         dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                         sc->iscan, qm_ptr, iqm_ptr, qparam->log_scale);
  } else {
    switch (qparam->log_scale) {
      case 0:
        av1_quantize_fp(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_fp_QTX,
                        p->quant_fp_QTX, p->quant_shift_QTX, qcoeff_ptr,
                        dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                        sc->iscan);
        break;
      case 1:
        av1_quantize_fp_32x32(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_fp_QTX,
                              p->quant_fp_QTX, p->quant_shift_QTX, qcoeff_ptr,
                              dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                              sc->iscan);
        break;
      case 2:
        av1_quantize_fp_64x64(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_fp_QTX,
                              p->quant_fp_QTX, p->quant_shift_QTX, qcoeff_ptr,
                              dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                              sc->iscan);
        break;
      default: assert(0);
    }
  }
}